

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::FReadFunc::~FReadFunc(FReadFunc *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

FReadFunc() : SystemSubroutine(KnownSystemName::FRead, SubroutineKind::Function) {
        hasOutputArgs = true;
    }